

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statGet(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  ulong uVar2;
  ulong local_68;
  ulong local_60;
  u64 iVal;
  u64 nDistinct;
  undefined1 local_48 [4];
  int i;
  sqlite3_str sStat;
  StatAccum *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  sStat._24_8_ = sqlite3_value_blob(*argv);
  sqlite3StrAccumInit((StrAccum *)local_48,(sqlite3 *)0x0,(char *)0x0,0,
                      (*(int *)(sStat._24_8_ + 0x18) + 1) * 100);
  if (*(char *)(sStat._24_8_ + 0x1c) == '\0') {
    uVar1 = *(uint *)(sStat._24_8_ + 0xc);
  }
  else {
    uVar1 = *(uint *)(sStat._24_8_ + 8);
  }
  local_68 = (ulong)uVar1;
  sqlite3_str_appendf((StrAccum *)local_48,"%llu",local_68);
  for (nDistinct._4_4_ = 0; nDistinct._4_4_ < *(int *)(sStat._24_8_ + 0x18);
      nDistinct._4_4_ = nDistinct._4_4_ + 1) {
    uVar2 = (ulong)(*(int *)(*(long *)(sStat._24_8_ + 0x28) + (long)nDistinct._4_4_ * 4) + 1);
    local_60 = ((*(uint *)(sStat._24_8_ + 0xc) + uVar2) - 1) / uVar2;
    if ((local_60 == 2) && ((ulong)(uint)(*(int *)(sStat._24_8_ + 0xc) * 10) <= uVar2 * 0xb)) {
      local_60 = 1;
    }
    sqlite3_str_appendf((StrAccum *)local_48," %llu",local_60);
  }
  sqlite3ResultStrAccum(context,(StrAccum *)local_48);
  return;
}

Assistant:

static void statGet(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  StatAccum *p = (StatAccum*)sqlite3_value_blob(argv[0]);
#ifdef SQLITE_ENABLE_STAT4
  /* STAT4 has a parameter on this routine. */
  int eCall = sqlite3_value_int(argv[1]);
  assert( argc==2 );
  assert( eCall==STAT_GET_STAT1 || eCall==STAT_GET_NEQ
       || eCall==STAT_GET_ROWID || eCall==STAT_GET_NLT
       || eCall==STAT_GET_NDLT
  );
  assert( eCall==STAT_GET_STAT1 || p->mxSample );
  if( eCall==STAT_GET_STAT1 )
#else
  assert( argc==1 );
#endif
  {
    /* Return the value to store in the "stat" column of the sqlite_stat1
    ** table for this index.
    **
    ** The value is a string composed of a list of integers describing
    ** the index. The first integer in the list is the total number of
    ** entries in the index. There is one additional integer in the list
    ** for each indexed column. This additional integer is an estimate of
    ** the number of rows matched by a equality query on the index using
    ** a key with the corresponding number of fields. In other words,
    ** if the index is on columns (a,b) and the sqlite_stat1 value is
    ** "100 10 2", then SQLite estimates that:
    **
    **   * the index contains 100 rows,
    **   * "WHERE a=?" matches 10 rows, and
    **   * "WHERE a=? AND b=?" matches 2 rows.
    **
    ** If D is the count of distinct values and K is the total number of
    ** rows, then each estimate is usually computed as:
    **
    **        I = (K+D-1)/D
    **
    ** In other words, I is K/D rounded up to the next whole integer.
    ** However, if I is between 1.0 and 1.1 (in other words if I is
    ** close to 1.0 but just a little larger) then do not round up but
    ** instead keep the I value at 1.0.
    */
    sqlite3_str sStat;   /* Text of the constructed "stat" line */
    int i;               /* Loop counter */

    sqlite3StrAccumInit(&sStat, 0, 0, 0, (p->nKeyCol+1)*100);
    sqlite3_str_appendf(&sStat, "%llu",
        p->nSkipAhead ? (u64)p->nEst : (u64)p->nRow);
    for(i=0; i<p->nKeyCol; i++){
      u64 nDistinct = p->current.anDLt[i] + 1;
      u64 iVal = (p->nRow + nDistinct - 1) / nDistinct;
      if( iVal==2 && p->nRow*10 <= nDistinct*11 ) iVal = 1;
      sqlite3_str_appendf(&sStat, " %llu", iVal);
      assert( p->current.anEq[i] );
    }
    sqlite3ResultStrAccum(context, &sStat);
  }
#ifdef SQLITE_ENABLE_STAT4
  else if( eCall==STAT_GET_ROWID ){
    if( p->iGet<0 ){
      samplePushPrevious(p, 0);
      p->iGet = 0;
    }
    if( p->iGet<p->nSample ){
      StatSample *pS = p->a + p->iGet;
      if( pS->nRowid==0 ){
        sqlite3_result_int64(context, pS->u.iRowid);
      }else{
        sqlite3_result_blob(context, pS->u.aRowid, pS->nRowid,
                            SQLITE_TRANSIENT);
      }
    }
  }else{
    tRowcnt *aCnt = 0;
    sqlite3_str sStat;
    int i;

    assert( p->iGet<p->nSample );
    switch( eCall ){
      case STAT_GET_NEQ:  aCnt = p->a[p->iGet].anEq; break;
      case STAT_GET_NLT:  aCnt = p->a[p->iGet].anLt; break;
      default: {
        aCnt = p->a[p->iGet].anDLt;
        p->iGet++;
        break;
      }
    }
    sqlite3StrAccumInit(&sStat, 0, 0, 0, p->nCol*100);
    for(i=0; i<p->nCol; i++){
      sqlite3_str_appendf(&sStat, "%llu ", (u64)aCnt[i]);
    }
    if( sStat.nChar ) sStat.nChar--;
    sqlite3ResultStrAccum(context, &sStat);
  }
#endif /* SQLITE_ENABLE_STAT4 */
#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( argc );
#endif
}